

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall benchmark::internal::BenchmarkImp::Range(BenchmarkImp *this,int start,int limit)

{
  pointer piVar1;
  pointer piVar2;
  int i;
  vector<int,_std::allocator<int>_> arglist;
  int local_50;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  if ((this->arg_count_ != 1) && (this->arg_count_ != -1)) {
    CheckHandler::CheckHandler
              ((CheckHandler *)&local_48,"arg_count_ == -1 || arg_count_ == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"Range",0x1a7);
    CheckHandler::~CheckHandler((CheckHandler *)&local_48);
  }
  GetNullLogInstance();
  this->arg_count_ = 1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  AddRange(&local_48,start,limit,8);
  piVar1 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      local_4c = *piVar2;
      local_50 = -1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->args_,
                 &local_4c,&local_50);
      piVar2 = piVar2 + 1;
    } while (piVar2 != piVar1);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BenchmarkImp::Range(int start, int limit) {
  CHECK(arg_count_ == -1 || arg_count_ == 1);
  arg_count_ = 1;
  std::vector<int> arglist;
  AddRange(&arglist, start, limit, kRangeMultiplier);

  for (int i : arglist) {
    args_.emplace_back(i, -1);
  }
}